

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

ALCdevice *
alcCaptureOpenDevice(ALCchar *devicename,ALCuint frequency,ALCenum format,ALCsizei buffersize)

{
  DeviceWrapper **ppDVar1;
  ALCboolean AVar2;
  DeviceWrapper *device;
  ALCdevice *pAVar3;
  ALCchar *pAVar4;
  DeviceWrapper *pDVar5;
  ALCint alci;
  
  device = (DeviceWrapper *)calloc(1,0x838);
  if (device != (DeviceWrapper *)0x0) {
    APILOCK();
    IO_ENTRYINFO(ALEE_alcCaptureOpenDevice);
    IO_STRING(devicename);
    writele32(frequency);
    writele32(format);
    IO_ALSIZEI(buffersize);
    pAVar3 = (*REAL_alcCaptureOpenDevice)(devicename,frequency,format,buffersize);
    pDVar5 = device;
    if (pAVar3 == (ALCdevice *)0x0) {
      pDVar5 = (DeviceWrapper *)0x0;
    }
    IO_UINT64((uint64)pDVar5);
    if (pAVar3 == (ALCdevice *)0x0) {
      free(device);
    }
    else {
      alci = 0;
      device->device = pAVar3;
      device->iscapture = '\x01';
      device->connected = '\x01';
      AVar2 = (*REAL_alcIsExtensionPresent)(pAVar3,"ALC_EXT_disconnect");
      device->supports_disconnect_ext = AVar2;
      if (format - 0x1100U < 4) {
        device->samplesize = *(int *)(&DAT_0010b040 + (ulong)(format - 0x1100U) * 4);
      }
      device->next = null_device.next;
      device->prev = &null_device;
      pDVar5 = device;
      if (null_device.next != (DeviceWrapper *)0x0) {
        ppDVar1 = &(null_device.next)->prev;
        null_device.next = device;
        *ppDVar1 = device;
        pDVar5 = null_device.next;
      }
      null_device.next = pDVar5;
      (*REAL_alcGetIntegerv)(device->device,0x1000,1,&alci);
      writele32(alci);
      (*REAL_alcGetIntegerv)(device->device,0x1001,1,&alci);
      writele32(alci);
      pAVar4 = (*REAL_alcGetString)(device->device,0x310);
      IO_STRING(pAVar4);
      pAVar4 = (*REAL_alcGetString)(device->device,0x1006);
      IO_STRING(pAVar4);
    }
    check_alc_error_events(device);
    check_al_async_states();
    APIUNLOCK();
  }
  return (ALCdevice *)device;
}

Assistant:

ALCdevice *alcCaptureOpenDevice(const ALCchar *devicename, ALCuint frequency, ALCenum format, ALCsizei buffersize)
{
    DeviceWrapper *device = (DeviceWrapper *) calloc(1, sizeof (DeviceWrapper));
    ALCdevice *retval;

    if (!device) {
        return NULL;
    }

    IO_START(alcCaptureOpenDevice);
    IO_STRING(devicename);
    IO_UINT32(frequency);
    IO_ALCENUM(format);
    IO_ALSIZEI(buffersize);
    retval = REAL_alcCaptureOpenDevice(devicename, frequency, format, buffersize);
    IO_PTR(retval ? device : NULL);

    if (!retval) {
        free(device);
    } else {
        ALCint alci = 0;
        const ALCchar *alcstr;

        device->device = retval;
        device->iscapture = ALC_TRUE;
        device->connected = ALC_TRUE;
        device->supports_disconnect_ext = REAL_alcIsExtensionPresent(device->device, "ALC_EXT_disconnect");
        if (format == AL_FORMAT_MONO8) {
            device->samplesize = 1;
        } else if (format == AL_FORMAT_MONO16) {
            device->samplesize = 2;
        } else if (format == AL_FORMAT_STEREO8) {
            device->samplesize = 2;
        } else if (format == AL_FORMAT_STEREO16) {
            device->samplesize = 4;
            // !!! FIXME: float32
        }

        device->next = null_device.next;
        device->prev = &null_device;
        null_device.next = device;
        if (device->next) {
            device->next->prev = device;
        }

        REAL_alcGetIntegerv(device->device, ALC_MAJOR_VERSION, 1, &alci);
        IO_INT32(alci);
        REAL_alcGetIntegerv(device->device, ALC_MINOR_VERSION, 1, &alci);
        IO_INT32(alci);
        alcstr = REAL_alcGetString(device->device, ALC_CAPTURE_DEVICE_SPECIFIER);
        IO_STRING(alcstr);
        alcstr = REAL_alcGetString(device->device, ALC_EXTENSIONS);
        IO_STRING(alcstr);
    }

    IO_END_ALC(device);
    return (ALCdevice *) device;
}